

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O2

void __thiscall TSMuxer::parseMuxOpt(TSMuxer *this,string *opts)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  int32_t value;
  int64_t iVar5;
  size_type sVar6;
  pointer value_00;
  double dVar7;
  double dVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paramPair;
  string postfix;
  string prefix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  params;
  
  splitStr_abi_cxx11_(&params,(opts->_M_dataplus)._M_p,' ');
  value_00 = params.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (value_00 ==
        params.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&params);
      return;
    }
    trimStr(&postfix,value_00);
    splitStr_abi_cxx11_(&paramPair,postfix._M_dataplus._M_p,'=');
    std::__cxx11::string::~string((string *)&postfix);
    if (paramPair.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        paramPair.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar4 = std::operator==(paramPair.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,"--no-pcr-on-video-pid");
      if (bVar4) {
        this->m_pcrOnVideo = false;
      }
      else {
        bVar4 = std::operator==(paramPair.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,"--new-audio-pes");
        if (bVar4) {
          this->m_useNewStyleAudioPES = true;
        }
        else {
          bVar4 = std::operator==(paramPair.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,"--no-hdmv-descriptors")
          ;
          if (bVar4) {
            this->m_hdmvDescriptors = false;
          }
          else {
            bVar4 = std::operator==(paramPair.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,"--bitrate");
            if ((bVar4) &&
               (0x20 < (ulong)((long)paramPair.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)paramPair.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start))) {
              dVar7 = strToDouble(paramPair.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
              this->m_cbrBitrate = (int)(dVar7 * 1000.0);
              dVar7 = strToDouble(paramPair.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
LAB_001e0d8d:
              this->m_minBitrate = (int)(dVar7 * 1000.0);
            }
            else {
              bVar4 = std::operator==(paramPair.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,"--maxbitrate");
              if ((bVar4) &&
                 (0x20 < (ulong)((long)paramPair.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)paramPair.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start))) {
                dVar7 = strToDouble(paramPair.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
                this->m_cbrBitrate = (int)(dVar7 * 1000.0);
              }
              else {
                bVar4 = std::operator==(paramPair.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,"--minbitrate");
                if ((bVar4) &&
                   (0x20 < (ulong)((long)paramPair.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)paramPair.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start))) {
                  dVar7 = strToDouble(paramPair.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p)
                  ;
                  goto LAB_001e0d8d;
                }
                bVar4 = std::operator==(paramPair.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,"--vbv-len");
                if ((bVar4) &&
                   (0x20 < (ulong)((long)paramPair.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)paramPair.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start))) {
                  value = strToInt32(paramPair.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
                  setVBVBufferLen(this,value);
                }
                else {
                  bVar4 = std::operator==(paramPair.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          "--split-duration");
                  if (bVar4) {
                    iVar5 = strToInt64(paramPair.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p
                                      );
                    this->m_splitDuration = iVar5 * 0x13b6d8300;
LAB_001e0e0f:
                    this->m_computeMuxStats = true;
                  }
                  else {
                    bVar4 = std::operator==(paramPair.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start,"--split-size"
                                           );
                    if (bVar4) {
                      postfix._M_string_length = 0;
                      postfix.field_2._M_local_buf[0] = '\0';
                      pcVar2 = paramPair.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
                      sVar3 = paramPair.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length;
                      postfix._M_dataplus._M_p = (pointer)&postfix.field_2;
                      for (sVar6 = 0; sVar3 != sVar6; sVar6 = sVar6 + 1) {
                        cVar1 = pcVar2[sVar6];
                        if (cVar1 != '.' && 9 < (byte)(cVar1 - 0x30U)) {
                          std::__cxx11::string::push_back((char)&postfix);
                        }
                      }
                      strToUpperCase(&prefix,&postfix);
                      std::__cxx11::string::operator=((string *)&postfix,(string *)&prefix);
                      std::__cxx11::string::~string((string *)&prefix);
                      bVar4 = std::operator==(&postfix,"GB");
                      dVar7 = 1000000000.0;
                      if (!bVar4) {
                        bVar4 = std::operator==(&postfix,"GIB");
                        dVar7 = 1073741824.0;
                        if (!bVar4) {
                          bVar4 = std::operator==(&postfix,"MB");
                          dVar7 = 1000000.0;
                          if (!bVar4) {
                            bVar4 = std::operator==(&postfix,"MIB");
                            dVar7 = 1048576.0;
                            if (!bVar4) {
                              bVar4 = std::operator==(&postfix,"KB");
                              dVar7 = 1000.0;
                              if (!bVar4) {
                                bVar4 = std::operator==(&postfix,"KIB");
                                dVar7 = 1.0;
                                if (bVar4) {
                                  dVar7 = 1024.0;
                                }
                              }
                            }
                          }
                        }
                      }
                      std::__cxx11::string::substr
                                ((ulong)&prefix,
                                 (ulong)(paramPair.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 1));
                      dVar8 = strToDouble(prefix._M_dataplus._M_p);
                      this->m_splitSize = (uint32_t)(long)(dVar7 * dVar8);
                      this->m_computeMuxStats = true;
                      std::__cxx11::string::~string((string *)&prefix);
                      std::__cxx11::string::~string((string *)&postfix);
                    }
                    else {
                      bVar4 = std::operator==(paramPair.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start,"--blu-ray")
                      ;
                      if (((bVar4) ||
                          (bVar4 = std::operator==(paramPair.
                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  "--blu-ray-v3"), bVar4)) ||
                         (bVar4 = std::operator==(paramPair.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  "--avchd"), bVar4)) {
                        this->m_bluRayMode = true;
                        this->m_computeMuxStats = true;
                      }
                      else {
                        bVar4 = std::operator==(paramPair.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                                "--cut-start");
                        if ((bVar4) ||
                           (bVar4 = std::operator==(paramPair.
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  "--cut-end"), bVar4)) goto LAB_001e0e0f;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&paramPair);
    value_00 = value_00 + 1;
  } while( true );
}

Assistant:

void TSMuxer::parseMuxOpt(const std::string& opts)
{
    const vector<string> params = splitStr(opts.c_str(), ' ');
    for (auto& i : params)
    {
        vector<string> paramPair = splitStr(trimStr(i).c_str(), '=');
        if (paramPair.empty())
            continue;
        if (paramPair[0] == "--no-pcr-on-video-pid")
            setPCROnVideoPID(false);
        else if (paramPair[0] == "--new-audio-pes")
            setNewStyleAudioPES(true);
        else if (paramPair[0] == "--no-hdmv-descriptors")
            m_hdmvDescriptors = false;
        else if (paramPair[0] == "--bitrate" && paramPair.size() > 1)
        {
            setMaxBitrate(static_cast<int>(strToDouble(paramPair[1].c_str()) * 1000.0));
            setMinBitrate(static_cast<int>(strToDouble(paramPair[1].c_str()) * 1000.0));
        }
        else if (paramPair[0] == "--maxbitrate" && paramPair.size() > 1)
            setMaxBitrate(static_cast<int>(strToDouble(paramPair[1].c_str()) * 1000.0));
        else if (paramPair[0] == "--minbitrate" && paramPair.size() > 1)
            setMinBitrate(static_cast<int>(strToDouble(paramPair[1].c_str()) * 1000.0));
        else if (paramPair[0] == "--vbv-len" && paramPair.size() > 1)
            setVBVBufferLen(strToInt32(paramPair[1].c_str()));
        else if (paramPair[0] == "--split-duration")
        {
            setSplitDuration(strToInt64(paramPair[1].c_str()) * INTERNAL_PTS_FREQ);
            m_computeMuxStats = true;
        }
        else if (paramPair[0] == "--split-size")
        {
            int64_t coeff = 1;
            string postfix;
            for (const auto& j : paramPair[1])
                if (!((j >= '0' && j <= '9') || j == '.'))
                    postfix += j;
            postfix = strToUpperCase(postfix);
            if (postfix == "GB")
                coeff = 1000LL * 1000 * 1000;
            else if (postfix == "GIB")
                coeff = 1024LL * 1024 * 1024;
            else if (postfix == "MB")
                coeff = 1000LL * 1000;
            else if (postfix == "MIB")
                coeff = 1024LL * 1024;
            else if (postfix == "KB")
                coeff = 1000;
            else if (postfix == "KIB")
                coeff = 1024;
            string prefix = paramPair[1].substr(0, paramPair[1].size() - postfix.size());
            setSplitSize(static_cast<uint32_t>(strToDouble(prefix.c_str()) * static_cast<double>(coeff)));
            m_computeMuxStats = true;
        }
        else if (paramPair[0] == "--blu-ray" || paramPair[0] == "--blu-ray-v3" || paramPair[0] == "--avchd")
        {
            m_bluRayMode = true;
            m_computeMuxStats = true;
        }
        else if (paramPair[0] == "--cut-start" || paramPair[0] == "--cut-end")
        {
            m_computeMuxStats = true;
        }
    }
}